

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

xformAtomRecords * newXformAtomRecord(char *rec,abrMkAtomProc *mkAtom,void *atomstuff)

{
  atom *paVar1;
  atomPtr paVar2;
  xformAtomRecords *local_30;
  xformAtomRecords *xr;
  void *atomstuff_local;
  abrMkAtomProc *mkAtom_local;
  char *rec_local;
  
  local_30 = (xformAtomRecords *)0x0;
  if (rec != (char *)0x0) {
    local_30 = (xformAtomRecords *)malloc(0x28);
    if (local_30 == (xformAtomRecords *)0x0) {
      warn("could not create Xform atom record");
      return (xformAtomRecords *)0x0;
    }
    local_30->next = (xformAtomRecords_t *)0x0;
    paVar2 = (*mkAtom)(rec,atomstuff);
    local_30->a = paVar2;
    if (local_30->a == (atom *)0x0) {
      free(local_30);
      local_30 = (xformAtomRecords *)0x0;
    }
    else {
      paVar1 = local_30->a;
      (local_30->loc).x = (paVar1->loc).x;
      (local_30->loc).y = (paVar1->loc).y;
      (local_30->loc).z = (paVar1->loc).z;
    }
  }
  return local_30;
}

Assistant:

xformAtomRecords * newXformAtomRecord(char *rec, abrMkAtomProc mkAtom, void *atomstuff) {
   xformAtomRecords *xr = NULL;
   int getAtno(int);

   if (rec) {
      xr = (xformAtomRecords *)malloc(sizeof(xformAtomRecords));
      if (!xr) {
         warn("could not create Xform atom record");
         return NULL;
      }
      xr->next = NULL;
      xr->a = mkAtom(rec, atomstuff);

      if (xr->a) {
	                       /* record the original position on the atom */
	 xr->loc = xr->a->loc; /* so that we can continually return to it  */
      }
      else {
	 free(xr); /* may be an H when implicitH processing is being used */
	 xr = NULL;
      }
   }
   return xr;
}